

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O3

void * __thiscall TCMalloc_PageMap3<10>::Next(TCMalloc_PageMap3<10> *this,Number k)

{
  Node *pNVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (k < 0x400) {
    do {
      pNVar1 = (this->root_).ptrs[k >> 6];
      uVar6 = (uint)k;
      if (pNVar1 == (Node *)0x0) {
        lVar4 = 0x40;
        uVar5 = 0x3c0;
      }
      else {
        lVar2 = *(long *)((long)pNVar1->ptrs + (ulong)(uVar6 & 0x3c) * 2);
        lVar4 = 4;
        uVar5 = 0x3fc;
        if (lVar2 != 0) {
          uVar7 = (ulong)(uVar6 & 3);
          do {
            pvVar3 = *(void **)(lVar2 + uVar7 * 8);
            if (pvVar3 != (void *)0x0) {
              return pvVar3;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != 4);
        }
      }
      k = (ulong)(uVar6 & uVar5) + lVar4;
    } while (k < 0x400);
  }
  return (void *)0x0;
}

Assistant:

void* Next(Number k) const {
    while (k < (Number(1) << BITS)) {
      const Number i1 = k >> (LEAF_BITS + INTERIOR_BITS);
      const Number i2 = (k >> LEAF_BITS) & (INTERIOR_LENGTH-1);
      if (root_.ptrs[i1] == nullptr) {
        // Advance to next top-level entry
        k = (i1 + 1) << (LEAF_BITS + INTERIOR_BITS);
      } else {
        Leaf* leaf = reinterpret_cast<Leaf*>(root_.ptrs[i1]->ptrs[i2]);
        if (leaf != nullptr) {
          for (Number i3 = (k & (LEAF_LENGTH-1)); i3 < LEAF_LENGTH; i3++) {
            if (leaf->values[i3] != nullptr) {
              return leaf->values[i3];
            }
          }
        }
        // Advance to next interior entry
        k = ((k >> LEAF_BITS) + 1) << LEAF_BITS;
      }
    }
    return nullptr;
  }